

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O0

Result __thiscall spectest::CommandRunner::Run(CommandRunner *this,Script *script)

{
  bool bVar1;
  Result RVar2;
  reference this_00;
  pointer pCVar3;
  ModuleCommand *command_00;
  ActionCommandBase<(wabt::CommandType)1> *command_01;
  RegisterCommand *command_02;
  AssertModuleCommand<(wabt::CommandType)3> *command_03;
  AssertModuleCommand<(wabt::CommandType)4> *command_04;
  AssertModuleCommand<(wabt::CommandType)5> *command_05;
  AssertModuleCommand<(wabt::CommandType)6> *command_06;
  AssertReturnCommand *command_07;
  AssertTrapCommandBase<(wabt::CommandType)8> *command_08;
  AssertTrapCommandBase<(wabt::CommandType)9> *command_09;
  CommandPtr *command;
  const_iterator __end1;
  const_iterator __begin1;
  CommandPtrVector *__range1;
  Script *script_local;
  CommandRunner *this_local;
  
  std::__cxx11::string::operator=((string *)&this->source_filename_,(string *)script);
  __end1 = std::
           vector<std::unique_ptr<spectest::Command,_std::default_delete<spectest::Command>_>,_std::allocator<std::unique_ptr<spectest::Command,_std::default_delete<spectest::Command>_>_>_>
           ::begin(&script->commands);
  command = (CommandPtr *)
            std::
            vector<std::unique_ptr<spectest::Command,_std::default_delete<spectest::Command>_>,_std::allocator<std::unique_ptr<spectest::Command,_std::default_delete<spectest::Command>_>_>_>
            ::end(&script->commands);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::unique_ptr<spectest::Command,_std::default_delete<spectest::Command>_>_*,_std::vector<std::unique_ptr<spectest::Command,_std::default_delete<spectest::Command>_>,_std::allocator<std::unique_ptr<spectest::Command,_std::default_delete<spectest::Command>_>_>_>_>
                                     *)&command), bVar1) {
    this_00 = __gnu_cxx::
              __normal_iterator<const_std::unique_ptr<spectest::Command,_std::default_delete<spectest::Command>_>_*,_std::vector<std::unique_ptr<spectest::Command,_std::default_delete<spectest::Command>_>,_std::allocator<std::unique_ptr<spectest::Command,_std::default_delete<spectest::Command>_>_>_>_>
              ::operator*(&__end1);
    pCVar3 = std::unique_ptr<spectest::Command,_std::default_delete<spectest::Command>_>::operator->
                       (this_00);
    switch(pCVar3->type) {
    case First:
      pCVar3 = std::unique_ptr<spectest::Command,_std::default_delete<spectest::Command>_>::get
                         (this_00);
      command_00 = wabt::cast<spectest::ModuleCommand,spectest::Command>(pCVar3);
      OnModuleCommand(this,command_00);
      break;
    case Action:
      pCVar3 = std::unique_ptr<spectest::Command,_std::default_delete<spectest::Command>_>::get
                         (this_00);
      command_01 = wabt::cast<spectest::ActionCommandBase<(wabt::CommandType)1>,spectest::Command>
                             (pCVar3);
      RVar2 = OnActionCommand(this,command_01);
      TallyCommand(this,RVar2);
      break;
    case Register:
      pCVar3 = std::unique_ptr<spectest::Command,_std::default_delete<spectest::Command>_>::get
                         (this_00);
      command_02 = wabt::cast<spectest::RegisterCommand,spectest::Command>(pCVar3);
      OnRegisterCommand(this,command_02);
      break;
    case AssertMalformed:
      pCVar3 = std::unique_ptr<spectest::Command,_std::default_delete<spectest::Command>_>::get
                         (this_00);
      command_03 = wabt::cast<spectest::AssertModuleCommand<(wabt::CommandType)3>,spectest::Command>
                             (pCVar3);
      RVar2 = OnAssertMalformedCommand(this,command_03);
      TallyCommand(this,RVar2);
      break;
    case AssertInvalid:
      pCVar3 = std::unique_ptr<spectest::Command,_std::default_delete<spectest::Command>_>::get
                         (this_00);
      command_04 = wabt::cast<spectest::AssertModuleCommand<(wabt::CommandType)4>,spectest::Command>
                             (pCVar3);
      RVar2 = OnAssertInvalidCommand(this,command_04);
      TallyCommand(this,RVar2);
      break;
    case AssertUnlinkable:
      pCVar3 = std::unique_ptr<spectest::Command,_std::default_delete<spectest::Command>_>::get
                         (this_00);
      command_05 = wabt::cast<spectest::AssertModuleCommand<(wabt::CommandType)5>,spectest::Command>
                             (pCVar3);
      RVar2 = OnAssertUnlinkableCommand(this,command_05);
      TallyCommand(this,RVar2);
      break;
    case AssertUninstantiable:
      pCVar3 = std::unique_ptr<spectest::Command,_std::default_delete<spectest::Command>_>::get
                         (this_00);
      command_06 = wabt::cast<spectest::AssertModuleCommand<(wabt::CommandType)6>,spectest::Command>
                             (pCVar3);
      RVar2 = OnAssertUninstantiableCommand(this,command_06);
      TallyCommand(this,RVar2);
      break;
    case AssertReturn:
      pCVar3 = std::unique_ptr<spectest::Command,_std::default_delete<spectest::Command>_>::get
                         (this_00);
      command_07 = wabt::cast<spectest::AssertReturnCommand,spectest::Command>(pCVar3);
      RVar2 = OnAssertReturnCommand(this,command_07);
      TallyCommand(this,RVar2);
      break;
    case AssertTrap:
      pCVar3 = std::unique_ptr<spectest::Command,_std::default_delete<spectest::Command>_>::get
                         (this_00);
      command_08 = wabt::
                   cast<spectest::AssertTrapCommandBase<(wabt::CommandType)8>,spectest::Command>
                             (pCVar3);
      RVar2 = OnAssertTrapCommand(this,command_08);
      TallyCommand(this,RVar2);
      break;
    case AssertExhaustion:
      pCVar3 = std::unique_ptr<spectest::Command,_std::default_delete<spectest::Command>_>::get
                         (this_00);
      command_09 = wabt::
                   cast<spectest::AssertTrapCommandBase<(wabt::CommandType)9>,spectest::Command>
                             (pCVar3);
      RVar2 = OnAssertExhaustionCommand(this,command_09);
      TallyCommand(this,RVar2);
    }
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<spectest::Command,_std::default_delete<spectest::Command>_>_*,_std::vector<std::unique_ptr<spectest::Command,_std::default_delete<spectest::Command>_>,_std::allocator<std::unique_ptr<spectest::Command,_std::default_delete<spectest::Command>_>_>_>_>
    ::operator++(&__end1);
  }
  wabt::Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

wabt::Result CommandRunner::Run(const Script& script) {
  source_filename_ = script.filename;

  for (const CommandPtr& command : script.commands) {
    switch (command->type) {
      case CommandType::Module:
        OnModuleCommand(cast<ModuleCommand>(command.get()));
        break;

      case CommandType::Action:
        TallyCommand(OnActionCommand(cast<ActionCommand>(command.get())));
        break;

      case CommandType::Register:
        OnRegisterCommand(cast<RegisterCommand>(command.get()));
        break;

      case CommandType::AssertMalformed:
        TallyCommand(OnAssertMalformedCommand(
            cast<AssertMalformedCommand>(command.get())));
        break;

      case CommandType::AssertInvalid:
        TallyCommand(
            OnAssertInvalidCommand(cast<AssertInvalidCommand>(command.get())));
        break;

      case CommandType::AssertUnlinkable:
        TallyCommand(OnAssertUnlinkableCommand(
            cast<AssertUnlinkableCommand>(command.get())));
        break;

      case CommandType::AssertUninstantiable:
        TallyCommand(OnAssertUninstantiableCommand(
            cast<AssertUninstantiableCommand>(command.get())));
        break;

      case CommandType::AssertReturn:
        TallyCommand(
            OnAssertReturnCommand(cast<AssertReturnCommand>(command.get())));
        break;

      case CommandType::AssertTrap:
        TallyCommand(
            OnAssertTrapCommand(cast<AssertTrapCommand>(command.get())));
        break;

      case CommandType::AssertExhaustion:
        TallyCommand(OnAssertExhaustionCommand(
            cast<AssertExhaustionCommand>(command.get())));
        break;
    }
  }

  return wabt::Result::Ok;
}